

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDsd.c
# Opt level: O2

If_DsdObj_t * If_DsdObjAlloc(If_DsdMan_t *p,int Type,int nFans)

{
  int iVar1;
  If_DsdObj_t *Entry;
  uint uVar2;
  
  Entry = (If_DsdObj_t *)Mem_FlexEntryFetch(p->pMem,((nFans & 1U) + nFans / 2) * 8 + 8);
  *Entry = (If_DsdObj_t)0x0;
  uVar2 = nFans << 0x1b | Type & 7U;
  *(uint *)&Entry->field_0x4 = uVar2;
  Entry->Id = (p->vObjs).nSize;
  *(uint *)&Entry->field_0x4 = (p->fNewAsUseless & 1U) << 8 | uVar2;
  Vec_PtrPush(&p->vObjs,Entry);
  Vec_IntPush(&p->vNexts,0);
  Vec_IntPush(&p->vTruths,-1);
  iVar1 = (p->vNexts).nSize;
  if (iVar1 != (p->vObjs).nSize) {
    __assert_fail("Vec_IntSize(&p->vNexts) == Vec_PtrSize(&p->vObjs)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDsd.c"
                  ,0x104,"If_DsdObj_t *If_DsdObjAlloc(If_DsdMan_t *, int, int)");
  }
  if ((p->vTruths).nSize == iVar1) {
    return Entry;
  }
  __assert_fail("Vec_IntSize(&p->vTruths) == Vec_PtrSize(&p->vObjs)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDsd.c"
                ,0x105,"If_DsdObj_t *If_DsdObjAlloc(If_DsdMan_t *, int, int)");
}

Assistant:

If_DsdObj_t * If_DsdObjAlloc( If_DsdMan_t * p, int Type, int nFans )
{
    int nWords = If_DsdObjWordNum( nFans );
    If_DsdObj_t * pObj = (If_DsdObj_t *)Mem_FlexEntryFetch( p->pMem, sizeof(word) * nWords );
    If_DsdObjClean( pObj );
    pObj->Type   = Type;
    pObj->nFans  = nFans;
    pObj->Id     = Vec_PtrSize( &p->vObjs );
    pObj->fMark  = p->fNewAsUseless;
    pObj->Count  = 0;
    Vec_PtrPush( &p->vObjs, pObj );
    Vec_IntPush( &p->vNexts, 0 );
    Vec_IntPush( &p->vTruths, -1 );
    assert( Vec_IntSize(&p->vNexts) == Vec_PtrSize(&p->vObjs) );
    assert( Vec_IntSize(&p->vTruths) == Vec_PtrSize(&p->vObjs) );
    return pObj;
}